

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handheld-halting.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  ostream *poVar4;
  long *plVar5;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar6;
  undefined8 in_RCX;
  int iVar7;
  long lVar8;
  ulong uVar9;
  program_t copy;
  program_t program;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  program_t local_278;
  int local_260 [4];
  machine_t local_250;
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> local_240;
  
  get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_240,argc,
            argv);
  if (local_240._M_index == '\0') {
    pvVar6 = std::get<0ul,int,std::ifstream>
                       ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                        &local_240);
    iVar7 = *pvVar6;
  }
  else {
    file_00 = std::get<1ul,int,std::ifstream>
                        ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_240);
    tokenize_abi_cxx11_<std::ifstream>(&local_290,file_00);
    handheld::read_program(&local_278,&local_290);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
    auVar2._4_8_ = 0;
    auVar2._0_4_ = (uint)in_RCX;
    local_290.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._0_12_ =
         handheld::execute((handheld *)&local_278,(program_t *)0x0,(machine_t)(auVar2 << 0x40));
    operator<<((ostream *)&std::cout,(machine_t *)&local_290);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_260[0] = 1;
    local_260[1] = 0;
    local_260[2] = 0;
    local_260[3] = 1;
    lVar8 = 0;
    do {
      if (local_278.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_278.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar9 = 0;
        do {
          std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::vector
                    ((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)&local_290,
                     &local_278);
          if (*(int *)&(&(local_290.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[uVar9]._M_p ==
              *(int *)((long)local_260 + lVar8)) {
            uVar1 = *(uint *)((long)local_260 + lVar8 + 4);
            *(uint *)&(&(local_290.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[uVar9]._M_p =
                 uVar1;
            auVar3._4_8_ = 0;
            auVar3._0_4_ = uVar1;
            local_250 = handheld::execute((handheld *)&local_290,(program_t *)0x0,
                                          (machine_t)(auVar3 << 0x40));
            if (local_250.exit == normal) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Part 2: Changed instruction ",0x1c);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              plVar5 = (long *)handheld::ins_strs._16_8_;
              if (handheld::ins_strs._16_8_ != 0) {
                do {
                  if ((int)plVar5[3] == *(int *)((long)local_260 + lVar8)) break;
                  plVar5 = (long *)*plVar5;
                } while (plVar5 != (long *)0x0);
              }
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,(char *)plVar5[2],plVar5[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," to ",4);
              plVar5 = (long *)handheld::ins_strs._16_8_;
              if (handheld::ins_strs._16_8_ != 0) {
                do {
                  if ((int)plVar5[3] == *(int *)((long)local_260 + lVar8 + 4)) break;
                  plVar5 = (long *)*plVar5;
                } while (plVar5 != (long *)0x0);
              }
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,(char *)plVar5[2],plVar5[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; ",2);
              operator<<(poVar4,&local_250);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            }
          }
          if (local_290.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_290.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_290.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_290.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)((long)local_278.
                                       super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_278.
                                       super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x10);
    if (local_278.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.
                      super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_278.
                            super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.
                            super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar7 = 0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
  ~_Variant_storage(&local_240);
  return iVar7;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  using namespace handheld;
  
  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto program = read_program(tokenize(input));

  std::cout << "Part 1: " << execute(program) << "\n";

  using from_to_t = std::pair<ins_e, ins_e>;
  for (const auto& [from, to] : { from_to_t{ins_e::jmp, ins_e::nop}, {ins_e::nop, ins_e::jmp} }) {
    for (size_t i = 0; i < program.size(); i++) {
      auto copy = program;
      if (copy[i].ins == from) {
        copy[i].ins = to;
        auto machine = execute(copy);
        if (machine.exit == machine_t::exit_e::normal)
          std::cout << "Part 2: Changed instruction " << i << " " << ins_str(from) << " to " << ins_str(to) << "; " << machine << "\n";
      }
    }
  }
}